

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  int *piVar1;
  int iVar2;
  int g_a;
  int g_a_00;
  int iVar3;
  void *buf;
  void *__ptr;
  int *__ptr_00;
  void *pvVar4;
  int iVar5;
  char *property;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  char *__format;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  size_t __size;
  int *piVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int *piVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  int hiC [2];
  int loC [2];
  int rank;
  int local_14c;
  int local_148;
  int ld;
  uint local_140;
  uint uStack_13c;
  int loA [2];
  uint local_118;
  uint local_114;
  void *local_110;
  uint local_104;
  int local_100;
  int local_fc;
  uint local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int lds;
  int ldC;
  int lda;
  int ldb;
  int loB [2];
  int bhi [2];
  int ahi [2];
  int pdy;
  int pdx;
  int nprocs;
  int one;
  void *local_b0;
  ulong local_a8;
  int dims [2];
  int blo [2];
  int alo [2];
  undefined8 local_50;
  undefined8 local_48;
  int argc_local;
  char **argv_local;
  
  one = 1;
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  MPI_Comm_size(&ompi_mpi_comm_world,&nprocs);
  MA_init(0x3e9,1000,1000);
  GA_Initialize();
  nprocs = GA_Nnodes();
  rank = GA_Nodeid();
  iVar2 = 0;
  while (iVar2 != 2) {
    property = "read_cache";
    if (iVar2 == 0) {
      property = "read_only";
    }
    uVar13 = 4;
    local_14c = iVar2;
    while (uVar12 = (uint)uVar13, uVar12 < 0x1001) {
      if (rank == 0) {
        fprintf(_stderr,"dim:%d start\n",uVar13);
      }
      uVar16 = uVar12 * uVar12;
      alo[0] = 0;
      alo[1] = 0;
      hiC[0] = uVar12 - 1;
      blo[0] = 0;
      blo[1] = 0;
      loC[0] = 0;
      loC[1] = 0;
      loA[0] = 0;
      loA[1] = 0;
      loB[0] = 0;
      loB[1] = 0;
      hiC[1] = hiC[0];
      local_140 = hiC[0];
      uStack_13c = hiC[0];
      local_118 = hiC[0];
      local_114 = hiC[0];
      local_104 = hiC[0];
      lda = uVar12;
      ldb = uVar12;
      bhi[0] = hiC[0];
      bhi[1] = hiC[0];
      ahi[0] = hiC[0];
      ahi[1] = hiC[0];
      dims[0] = uVar12;
      dims[1] = uVar12;
      local_b0 = malloc((ulong)(uVar16 * 4));
      for (uVar6 = 0; uVar16 != uVar6; uVar6 = uVar6 + 1) {
        *(int *)((long)local_b0 + uVar6 * 4) = (int)uVar6;
      }
      buf = malloc((ulong)(uVar16 * 4));
      for (uVar6 = 0; uVar16 != uVar6; uVar6 = uVar6 + 1) {
        *(int *)((long)buf + uVar6 * 4) = (int)uVar6;
      }
      iVar2 = NGA_Create(0x3e9,2,dims,"array_A",(int *)0x0);
      g_a = NGA_Create(0x3e9,2,dims,"array_B",(int *)0x0);
      g_a_00 = NGA_Create(0x3e9,2,dims,"array_C",(int *)0x0);
      GA_Zero(iVar2);
      GA_Zero(g_a);
      GA_Zero(g_a_00);
      NGA_Put(iVar2,alo,ahi,local_b0,&lda);
      NGA_Put(g_a,blo,bhi,buf,&ldb);
      GA_Sync();
      local_148 = iVar2;
      NGA_Set_property(iVar2,property);
      NGA_Set_property(g_a,property);
      GA_Sync();
      dVar22 = GA_Wtime();
      grid_factor(nprocs,&pdx,&pdy);
      local_f4 = pdx;
      uVar6 = (long)rank % (long)pdx;
      uVar21 = (long)rank / (long)pdx & 0xffffffff;
      iVar2 = (int)(uVar13 / (uVar13 >> 1));
      iVar5 = (int)(uVar13 >> 1);
      GA_Sync();
      local_100 = pdy;
      uVar15 = uVar6 & 0xffffffff;
      local_fc = iVar2 + (uint)((uint)(iVar2 * iVar5) < uVar12);
      local_f8 = (uint)uVar6;
      local_a8 = uVar13;
      while( true ) {
        uVar13 = local_a8;
        iVar19 = (int)uVar21;
        iVar2 = (int)local_a8;
        if (local_fc <= iVar19) break;
        iVar8 = (int)uVar15;
        loC[0] = iVar8 * iVar5;
        loC[1] = iVar19 * iVar5;
        iVar3 = (iVar8 + 1) * iVar5;
        hiC[1] = (iVar19 + 1) * iVar5 + -1;
        hiC[0] = iVar3 - 1;
        if (iVar2 < iVar3) {
          hiC[0] = local_104;
        }
        uVar12 = loC[0];
        iVar3 = iVar19 * iVar5;
        if (hiC[0] < loC[0]) {
          fprintf(_stderr,"%d: bad values for HiC LoC: %d  %d\n",(ulong)(uint)rank,
                  (ulong)(uint)hiC[0],(ulong)(uint)loC[0]);
          fprintf(_stderr,"%dL xcnt xbl: %d  %d\n",(ulong)(uint)rank,uVar15);
          GA_Error("cache_test: div by zero",0);
          uVar12 = loC[0];
          iVar3 = loC[1];
        }
        iVar17 = (hiC[0] - uVar12) + 1;
        iVar20 = (int)((long)((ulong)(uint)(iVar2 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
                      (long)iVar17);
        iVar20 = (uint)(iVar17 * iVar20 < iVar2) + iVar20;
        iVar3 = (hiC[1] - iVar3) + 1;
        __size = (size_t)(iVar17 * iVar3 * 4);
        __ptr = malloc(__size);
        local_110 = malloc(__size);
        __ptr_00 = (int *)malloc(__size);
        iVar2 = 0;
        local_f0 = iVar20;
        local_ec = 0;
        ldC = iVar3;
        if (0 < iVar20) {
          local_ec = iVar20;
        }
        for (; iVar2 != local_ec; iVar2 = iVar2 + 1) {
          iVar20 = ((int)uVar12 / iVar17 + iVar2) % local_f0;
          local_140 = hiC[0];
          ld = (hiC[0] - loC[0]) + 1;
          iVar3 = ld * iVar20 + alo[1];
          loA[1] = iVar3;
          loA[0] = loC[0];
          uStack_13c = iVar3 + (hiC[0] - loC[0]);
          if (ahi[1] <= (int)uStack_13c) {
            uStack_13c = ahi[1];
          }
          NGA_Get(local_148,loA,(int *)&local_140,local_110,&ld);
          if (4 < (uint)local_a8) {
            pvVar4 = malloc((long)(int)(((loC[1] ^ 0xffffffffU) + hiC[1]) *
                                       ((loC[0] ^ 0xffffffffU) + hiC[0])) << 2);
            local_50 = CONCAT44(uStack_13c - 1,local_140 - 1);
            lds = (local_140 - 1) - loA[0];
            local_48 = CONCAT44(loA[1] + 1,loA[0] + 1);
            NGA_Get(local_148,(int *)&local_48,(int *)&local_50,pvVar4,&lds);
          }
          local_114 = hiC[1];
          iVar3 = ((hiC[0] - loC[0]) + 1) * iVar20 + blo[0];
          loB[1] = loC[1];
          loB[0] = iVar3;
          local_118 = (hiC[0] - loC[0]) + iVar3;
          if (bhi[0] <= (int)local_118) {
            local_118 = bhi[0];
          }
          ld = (local_118 - iVar3) + 1;
          NGA_Get(g_a,loB,(int *)&local_118,__ptr_00,&ld);
          iVar3 = hiC[1] - loC[1];
          lVar7 = (long)(iVar3 + 1);
          pvVar4 = __ptr;
          for (lVar10 = 0; lVar10 <= (long)hiC[0] - (long)loC[0]; lVar10 = lVar10 + 1) {
            for (lVar11 = 0; lVar11 <= iVar3; lVar11 = lVar11 + 1) {
              *(undefined4 *)((long)pvVar4 + lVar11 * 4) = 0;
            }
            pvVar4 = (void *)((long)pvVar4 + lVar7 * 4);
          }
          pvVar4 = local_110;
          for (lVar10 = 0; lVar10 <= (long)hiC[0] - (long)loC[0]; lVar10 = lVar10 + 1) {
            piVar14 = __ptr_00;
            for (lVar11 = 0; lVar11 <= iVar3; lVar11 = lVar11 + 1) {
              piVar18 = piVar14;
              for (lVar9 = 0; lVar9 <= (int)(uStack_13c - loA[1]); lVar9 = lVar9 + 1) {
                piVar1 = (int *)((long)__ptr + lVar11 * 4 + lVar10 * lVar7 * 4);
                *piVar1 = *piVar1 + *piVar18 * *(int *)((long)pvVar4 + lVar9 * 4);
                piVar18 = piVar18 + lVar7;
              }
              piVar14 = piVar14 + 1;
            }
            pvVar4 = (void *)((long)pvVar4 + (long)(int)((uStack_13c - loA[1]) + 1) * 4);
          }
          NGA_Acc(g_a_00,loC,hiC,__ptr,&ldC,&one);
        }
        free(local_110);
        free(__ptr_00);
        free(__ptr);
        uVar12 = local_f8;
        iVar2 = local_100;
        if (iVar8 + local_f4 < local_fc) {
          uVar12 = iVar8 + local_f4;
          iVar2 = 0;
        }
        uVar15 = (ulong)uVar12;
        uVar21 = (ulong)(uint)(iVar2 + iVar19);
      }
      dVar23 = GA_Wtime();
      __format = "READ  - DIMSIZE: %5d  Time (us): %7.4f\n";
      if ((local_14c == 0 && rank == 0) ||
         (__format = "CACHE - DIMSIZE: %5d  Time (us): %7.4f\n", rank == 0 && local_14c != 0)) {
        printf(__format,(dVar23 - dVar22) * 1000000.0,uVar13 & 0xffffffff);
      }
      GA_Sync();
      iVar5 = local_148;
      NGA_Unset_property(local_148);
      NGA_Unset_property(g_a);
      GA_Destroy(iVar5);
      GA_Destroy(g_a);
      GA_Destroy(g_a_00);
      free(local_b0);
      free(buf);
      uVar13 = (ulong)(uint)(iVar2 * 2);
    }
    iVar2 = local_14c + 1;
  }
  GA_Terminate();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv) {

  int g_a, g_b, g_c;
  int one = 1;
  int rank, nprocs, kdim;
  int i, j, k;
  int ipx, ipy;
  int pdx, pdy;
  int xdim, ydim;
  int xbl, ybl;
  int xcdim, ycdim;
  int xnbl, ynbl;
  int xcnt, ycnt;
  int nb, ind, istart;
  int local_test;
  int ldtest = 5;
  int *local_A = NULL;
  int *local_B = NULL;
  double delta_t;
  int test;
  int dimsize;

  MPI_Init(&argc, &argv);

  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &nprocs);

  MA_init(C_INT, 1000, 1000);
  GA_Initialize();

  nprocs = GA_Nnodes();  
  rank = GA_Nodeid();   

  for (test = 0; test <= 1; test++) {
    for (dimsize = 4; dimsize <=4096; dimsize *= 2){
      if (rank == 0) fprintf(stderr,"dim:%d start\n",dimsize);

      int *abuf, *bbuf, *cbuf, *ctest;
      int full_size = dimsize*dimsize;
      int alo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int ahi[DIM] = {dimsize-1,dimsize-1};
      int blo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int bhi[DIM] = {dimsize-1,dimsize-1};
      int clo[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int chi[DIM] = {dimsize-1,dimsize-1};
      int loC[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiC[DIM] = {dimsize-1,dimsize-1};
      int loA[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiA[DIM] = {dimsize-1,dimsize-1};
      int loB[DIM] = {dimsize-dimsize,dimsize-dimsize};
      int hiB[DIM] = {dimsize-1,dimsize-1};
      int dims[DIM]={dimsize,dimsize};
      int ldb = hiB[0]-loB[0]+1;
      int ldc = hiC[0]-loC[0]+1;
      int lda = hiA[0]-loA[0]+1;
      int nlo, ldC;

      char* read_only = "read_only";
      char* read_cache = "read_cache";

      //subarray variables
      int sub_size;
      int *fullarray_test = (int*)malloc(full_size*sizeof(int));
      int *subarray_test;
      int loS[DIM], hiS[DIM];
      int lds;

      local_A=(int*)malloc(full_size*sizeof(int));
      for (i=0;i<full_size;i++){
        *(local_A + i) = i;
      }

      local_B=(int*)malloc(full_size*sizeof(int));
      for (i=0; i<full_size; i++){
        *(local_B + i) = i;
      }

      g_a = NGA_Create(C_INT, DIM, dims, "array_A", NULL);
      g_b = NGA_Create(C_INT, DIM, dims, "array_B", NULL);
      g_c = NGA_Create(C_INT, DIM, dims, "array_C", NULL);

      //fill GAs a and b with values to be multipled
      GA_Zero(g_a);
      GA_Zero(g_b);
      GA_Zero(g_c);

      NGA_Put(g_a, alo, ahi, local_A, &lda);
      NGA_Put(g_b, blo, bhi, local_B, &ldb);

      GA_Sync();
 
      if (test == 0) {
      NGA_Set_property(g_a, read_only);
      NGA_Set_property(g_b, read_only);
      }      
      if (test == 1) {
        NGA_Set_property(g_a, read_cache);
        NGA_Set_property(g_b, read_cache);
      }

      GA_Sync();

      delta_t = GA_Wtime();

      grid_factor(nprocs, &pdx, &pdy);

      //coordinates of processor for grid
      ipx = rank%pdx;
      ipy = (rank-ipx)/pdx; 
      xdim = dimsize;
      ydim = dimsize;

      if (dimsize <= 64) {
        xbl = dimsize/2;
        ybl = dimsize/2;
      } else {
        xbl = dimsize/2;
        ybl = dimsize/2;
      }

      //total number of blocks on each dimension
      xnbl = xdim/xbl;
      ynbl = ydim/ybl;
      if ((xnbl * xbl) < xdim) xnbl++;
      if ((ynbl * ybl) < ydim) ynbl++;

      xcnt = ipx;
      ycnt = ipy;

      GA_Sync();

      while (ycnt < ynbl) {
        int num_blocks, offset;
        int elemsize, ld;
        int *a_buf = NULL;
        int *b_buf = NULL;
        int *c_buf = NULL;
        int test_buf;
        int size_a, size_b, size_c;

        loC[0] = xcnt * xbl;
        loC[1] = ycnt * ybl;
        hiC[0] = (xcnt + 1) * xbl - 1;
        hiC[1] = (ycnt + 1) * ybl - 1;

        if (hiC[0] >= xdim) hiC[0] = xdim - 1;
        if (hiC[0] >= ydim) hiC[0] = ydim - 1;

	// stop to avoid FPE
	if ( hiC[0] < loC[0] ){
	  fprintf(stderr,"%d: bad values for HiC LoC: %d  %d\n", rank, hiC[0], loC[0]);
	  fprintf(stderr,"%dL xcnt xbl: %d  %d\n", rank, xcnt, xbl);
	  GA_Error("cache_test: div by zero", 0);
	}
        // Calculating number of blocks for inner dimension
        num_blocks = dimsize/(hiC[0]-loC[0]+1);
        if (num_blocks*(hiC[0]-loC[0]+1) < dimsize) num_blocks++;

        //set up buffers
        offset = 0;
        elemsize = sizeof(int);

        c_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        a_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        b_buf = (void*)malloc((hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize);
        
        test_buf = (hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1)*elemsize;
        size_c = (hiC[0]-loC[0]+1)*(hiC[1]-loC[1]+1);
        ldC = hiC[1]-loC[1]+1;
        
        // calculate starting block index
        istart = (loC[0]-clo[0])/(hiC[0]-loC[0]+1);
        
        // loop over block pairs
        for (nb=0; nb<num_blocks; nb++) {
          
          ind = istart + nb;
          ind = ind%num_blocks;
          
          nlo = alo[1]+ind*(hiC[0]-loC[0]+1);
          loA[0] = loC[0];
          hiA[0] = hiC[0];
          loA[1] = nlo;
          hiA[1] = loA[1]+(hiC[0]-loC[0]);
          if (hiA[1] > ahi[1]) hiA[1] = ahi[1];
          ld = hiA[0]-loA[0]+1;
          size_a = (hiA[0]-loA[0]+1)*(hiA[1]-loA[1]+1);
          
          NGA_Get(g_a,loA,hiA,a_buf,&ld);       
          
          if (dimsize > 4) {
          sub_size = (hiC[0]-loC[0]-1)*(hiC[1]-loC[1]-1);
          subarray_test = (int*)malloc(sub_size*sizeof(int)); 
          
          loS[0] = loA[0]+1;
          loS[1] = loA[1]+1;
          hiS[0] = hiA[0]-1;
          hiS[1] = hiA[1]-1;
          lds = hiS[0]-loS[0]+1;

          NGA_Get(g_a,loS,hiS,subarray_test,&lds);
          }          

          loB[1] = loC[1];
          hiB[1] = hiC[1];
          nlo = blo[0]+ind*(hiC[0]-loC[0]+1);
          loB[0] = nlo;
          hiB[0] = loB[0]+(hiC[0]-loC[0]);
          if (hiB[0] > bhi[0]) hiB[0] = bhi[0];
          ld = hiB[0]-loB[0]+1;
          size_b = (hiB[0]-loB[0]+1)*(hiB[1]-loB[1]+1);        

          NGA_Get(g_b,loB,hiB,b_buf,&ld);

          xcdim = hiC[0] - loC[0] + 1;
          ycdim = hiC[1] - loC[1] + 1;

          for (i = 0; i < xcdim; i++) {
            for (j = 0; j < ycdim; j++) {
              c_buf[i*ycdim+j] = 0.0;
            }
          }
          //transpose B to reduce page faults
          kdim = hiA[1] - loA[1] + 1;
          for (i = 0; i < xcdim; i++) {
            for (j = 0; j < ycdim; j++) {
              for (k = 0; k < kdim; k++) {
                c_buf[i*ycdim+j] += a_buf[i*kdim+k]*b_buf[k*ycdim+j];
              }
            }
          }

          NGA_Acc(g_c, loC, hiC, c_buf, &ldC, &one);

        }
         
        // multiplication is done, free buffers 
        free(a_buf);
        free(b_buf);
        free(c_buf);

        xcnt += pdx;

        if (xcnt >= xnbl) {
          xcnt = ipx;
          ycnt += pdy;
        }
      }

      delta_t = GA_Wtime()-delta_t;      
      if (dimsize == 0 & rank == 0) printf("\n"); 
      if (test == 0 && rank == 0) printf("READ  - DIMSIZE: %5d  Time (us): %7.4f\n",dimsize,delta_t*1.0e6);
      if (test == 1 && rank == 0) printf("CACHE - DIMSIZE: %5d  Time (us): %7.4f\n",dimsize,delta_t*1.0e6);

      GA_Sync();
      NGA_Unset_property(g_a);
      NGA_Unset_property(g_b);

#if 0 
      /* check multipy for correctness */
      abuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      bbuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      cbuf = (int*)malloc(sizeof(int)*dimsize*dimsize);
      ctest = (int*)malloc(sizeof(int)*dimsize*dimsize);
      /* get data from matrices a, b, c */
      NGA_Get(g_a,alo,ahi,abuf,&dimsize);
      NGA_Get(g_b,blo,bhi,bbuf,&dimsize);
      NGA_Get(g_c,clo,chi,ctest,&dimsize);
      for (i=0; i<dimsize; i++) {
        for (j=0; j<dimsize; j++) {
          cbuf[i*dimsize+j] = 0;
          for (k=0; k<dimsize; k++) {
            cbuf[i*dimsize+j] += abuf[i*dimsize+k]*bbuf[k*dimsize+j];
          }
          if (cbuf[i*dimsize+j] != ctest[i*dimsize+j] && rank == 0) {
            printf("mismatch for pair [%d,%d] expected: %d actual: %d\n",i,j,
                cbuf[i*dimsize+j],ctest[i*dimsize+j]);
          }
        }
      }
      free(abuf);
      free(bbuf);
      free(cbuf);
      free(ctest);
#endif

      GA_Destroy(g_a);
      GA_Destroy(g_b);
      GA_Destroy(g_c);
      free(local_A);
      free(local_B);     
    }
  }
  GA_Terminate();
  MPI_Finalize();
}